

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O2

void __thiscall
SStringViewArchive_WriteHello_Test::~SStringViewArchive_WriteHello_Test
          (SStringViewArchive_WriteHello_Test *this)

{
  anon_unknown.dwarf_2a9f47::SStringViewArchive::~SStringViewArchive
            (&this->super_SStringViewArchive);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (SStringViewArchive, WriteHello) {
    auto str = make_shared_sstring_view ("hello");

    mock_mutex mutex;
    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
    auto const first = pstore::typed_address<char> (this->current_pos (transaction));
    {
        auto writer = pstore::serialize::archive::make_writer (transaction);
        pstore::serialize::write (writer, str);
    }
    auto const last = pstore::typed_address<char> (this->current_pos (transaction));
    EXPECT_THAT (as_vector (first, last),
                 ::testing::ElementsAre ('\xb', '\x0', 'h', 'e', 'l', 'l', 'o'));
    {
        auto reader = pstore::serialize::archive::database_reader{db_, first.to_address ()};
        shared_sstring_view const actual = pstore::serialize::read<shared_sstring_view> (reader);
        EXPECT_EQ (actual, "hello");
    }
}